

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_addmul_v_uint64_30_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  ulong uVar1;
  int iVar2;
  uint j;
  long lVar3;
  bool bVar4;
  
  uVar1 = v->w64[1] >> 0x22;
  iVar2 = 0xf;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      c->w64[lVar3] =
           c->w64[lVar3] ^
           A->w64[lVar3 + 2] & (long)(uVar1 << 0x3e) >> 0x3f ^
           -(ulong)((uint)uVar1 & 1) & A->w64[lVar3];
    }
    uVar1 = uVar1 >> 2;
    A = A + 1;
  }
  return;
}

Assistant:

void mzd_addmul_v_uint64_30_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word idx = CONST_BLOCK(v, 0)->w64[1] >> 34;
  for (unsigned int i = 15; i; --i, idx >>= 2, ++Ablock) {
    const word mask1 = -(idx & 1);
    const word mask2 = -((idx >> 1) & 1);
    for (unsigned int j = 0; j < 2; ++j) {
      cblock->w64[j] ^= (Ablock->w64[j] & mask1) ^ (Ablock->w64[j + 2] & mask2);
    }
  }
}